

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::VerifyMark(LargeHeapBlock *this)

{
  LargeObjectHeader *address;
  Recycler *this_00;
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  LargeObjectHeader *pLVar5;
  uint i;
  uint index;
  LargeObjectHeader *addr;
  undefined8 *in_FS_OFFSET;
  undefined4 *local_40;
  
  if ((this->super_HeapBlock).needOOMRescan == false) {
    local_40 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)*in_FS_OFFSET;
    *local_40 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x3db,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar3) {
LAB_00267c60:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_40 = 0;
  }
  this_00 = this->heapInfo->recycler;
  index = 0;
  do {
    if (this->allocCount <= index) {
      return;
    }
    pLVar5 = GetHeaderByIndex(this,index);
    if (pLVar5 != (LargeObjectHeader *)0x0) {
      address = pLVar5 + 1;
      bVar3 = HeapBlockMap64::IsMarked(&this_00->heapBlockMap,address);
      if (bVar3) {
        bVar4 = LargeObjectHeader::GetAttributes(pLVar5,this->heapInfo->recycler->Cookie);
        if ((bVar4 & 4) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x3ee,"((attributes & NewFinalizeBit) == 0)",
                             "(attributes & NewFinalizeBit) == 0");
          if (!bVar3) goto LAB_00267c60;
          *local_40 = 0;
        }
        if ((bVar4 & 0x20) == 0) {
          if ((pLVar5->field_0x1a & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x3f5,"(!header->markOnOOMRescan)","!header->markOnOOMRescan");
            if (!bVar3) goto LAB_00267c60;
            *local_40 = 0;
          }
          sVar1 = pLVar5->objectSize;
          pLVar5 = address;
          while (addr = pLVar5, pLVar5 = (LargeObjectHeader *)&addr->objectSize,
                pLVar5 <= (undefined1 *)((long)&address->objectIndex + sVar1)) {
            bVar3 = Recycler::VerifyMark(this_00,addr,*(void **)addr);
            if (((bVar3) && (Js::Configuration::Global[0x2c156] == '\x01')) &&
               (Js::Configuration::Global[0x2c157] == '\x01')) {
              WBVerifyBitIsSet(this,(char *)addr);
            }
          }
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::VerifyMark()
{
    Assert(!this->needOOMRescan);
    Recycler* recycler = this->heapInfo->recycler;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();
        if (!recycler->heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(this->heapInfo->recycler->Cookie);

        Assert((attributes & NewFinalizeBit) == 0);

        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

        Assert(!header->markOnOOMRescan);

        char * objectAddressEnd = objectAddress + header->objectSize;

        while (objectAddress + sizeof(void *) <= objectAddressEnd)
        {
            void* target = *(void **)objectAddress;

            if (recycler->VerifyMark(objectAddress, target))
            {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                {
                    this->WBVerifyBitIsSet(objectAddress);
                }
#endif
            }

            objectAddress += sizeof(void *);
        }
    }
}